

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Type *ty)

{
  Type *ty_local;
  string *s;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (*(int *)this == 0) {
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"cubic");
  }
  else if (*(int *)this == 1) {
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"linear");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const GeomBasisCurves::Type &ty) {
  std::string s;

  switch (ty) {
    case GeomBasisCurves::Type::Cubic: {
      s = "cubic";
      break;
    }
    case GeomBasisCurves::Type::Linear: {
      s = "linear";
      break;
    }
  }

  return s;
}